

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

void roaring64_bitmap_and_inplace(roaring64_bitmap_t *r1,roaring64_bitmap_t *r2)

{
  uint8_t type2;
  _Bool _Var1;
  leaf_t *plVar2;
  long in_RSI;
  long in_RDI;
  _Bool erased;
  leaf_t leaf;
  container_t *container2;
  uint8_t typecode2;
  container_t *container;
  uint8_t typecode;
  leaf_t leaf2;
  leaf_t *leaf1;
  int compare_result;
  _Bool it2_present;
  art_iterator_t it2;
  art_iterator_t it1;
  undefined7 in_stack_fffffffffffffe48;
  uint8_t in_stack_fffffffffffffe4f;
  roaring64_bitmap_t *in_stack_fffffffffffffe50;
  leaf_t *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  uint8_t in_stack_fffffffffffffe67;
  art_iterator_t *in_stack_fffffffffffffe68;
  leaf_t *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  uint8_t in_stack_fffffffffffffe7f;
  leaf_t local_170;
  leaf_t *local_168;
  undefined7 in_stack_fffffffffffffeb0;
  uint8_t in_stack_fffffffffffffeb7;
  art_iterator_t *in_stack_fffffffffffffeb8;
  int local_138;
  leaf_t *local_128;
  leaf_t *local_98;
  
  if (in_RDI != in_RSI) {
    art_init_iterator((art_t *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                      SUB81((ulong)in_stack_fffffffffffffe58 >> 0x38,0));
    art_init_iterator((art_t *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                      SUB81((ulong)in_stack_fffffffffffffe58 >> 0x38,0));
    while (local_98 != (leaf_t *)0x0) {
      local_138 = 0;
      if ((local_128 != (leaf_t *)0x0) &&
         (local_138 = compare_high48((art_key_chunk_t *)in_stack_fffffffffffffe50,
                                     (art_key_chunk_t *)
                                     CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48)),
         local_138 == 0)) {
        in_stack_fffffffffffffeb8 = (art_iterator_t *)*local_128;
        type2 = get_typecode(*local_98);
        plVar2 = (leaf_t *)
                 get_container(in_stack_fffffffffffffe50,
                               CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48));
        in_stack_fffffffffffffeb7 = type2;
        if (type2 == '\x04') {
          in_stack_fffffffffffffe70 = plVar2;
          get_container(in_stack_fffffffffffffe50,
                        CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48));
          get_typecode((leaf_t)in_stack_fffffffffffffeb8);
          in_stack_fffffffffffffe7f = type2;
          local_168 = (leaf_t *)
                      container_and((container_t *)CONCAT17(type2,in_stack_fffffffffffffe78),
                                    (uint8_t)((ulong)in_stack_fffffffffffffe70 >> 0x38),
                                    in_stack_fffffffffffffe68,in_stack_fffffffffffffe67,
                                    (uint8_t *)in_stack_fffffffffffffe58);
          type2 = in_stack_fffffffffffffe67;
        }
        else {
          in_stack_fffffffffffffe58 = plVar2;
          in_stack_fffffffffffffe68 =
               (art_iterator_t *)
               get_container(in_stack_fffffffffffffe50,
                             CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48));
          get_typecode((leaf_t)in_stack_fffffffffffffeb8);
          local_168 = (leaf_t *)
                      container_iand((container_t *)
                                     CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                                     (uint8_t)((ulong)in_stack_fffffffffffffe70 >> 0x38),
                                     in_stack_fffffffffffffe68,type2,
                                     (uint8_t *)in_stack_fffffffffffffe58);
        }
        if (local_168 != plVar2) {
          container_free(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4f);
        }
        _Var1 = container_nonzero_cardinality
                          ((container_t *)
                           CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48),'\0');
        if (_Var1) {
          if (local_168 != plVar2) {
            replace_container((roaring64_bitmap_t *)CONCAT17(type2,in_stack_fffffffffffffe60),
                              in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                              in_stack_fffffffffffffe4f);
          }
          art_iterator_next((art_iterator_t *)0x108a43);
        }
        else {
          container_free(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4f);
          art_iterator_erase(in_stack_fffffffffffffeb8,
                             (art_val_t *)
                             CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
          remove_container(in_stack_fffffffffffffe50,
                           CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48));
        }
        art_iterator_next((art_iterator_t *)0x108a50);
        in_stack_fffffffffffffe67 = type2;
      }
      if ((local_128 != (leaf_t *)0x0) && (-1 < local_138)) {
        if (0 < local_138) {
          art_iterator_lower_bound
                    (in_stack_fffffffffffffe68,
                     (art_key_chunk_t *)
                     CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
        }
      }
      else {
        art_iterator_erase(in_stack_fffffffffffffeb8,
                           (art_val_t *)
                           CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
        in_stack_fffffffffffffe50 =
             (roaring64_bitmap_t *)
             get_container(in_stack_fffffffffffffe50,
                           CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48));
        get_typecode(local_170);
        container_free(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4f);
        remove_container(in_stack_fffffffffffffe50,
                         CONCAT17(in_stack_fffffffffffffe4f,in_stack_fffffffffffffe48));
      }
    }
  }
  return;
}

Assistant:

void roaring64_bitmap_and_inplace(roaring64_bitmap_t *r1,
                                  const roaring64_bitmap_t *r2) {
    if (r1 == r2) {
        return;
    }
    art_iterator_t it1 = art_init_iterator(&r1->art, /*first=*/true);
    art_iterator_t it2 = art_init_iterator((art_t *)&r2->art, /*first=*/true);

    while (it1.value != NULL) {
        // Cases:
        // 1. !it2_present -> erase it1
        // 2. it2_present
        //    a. it1 <  it2 -> erase it1
        //    b. it1 == it2 -> output it1 & it2, it1++, it2++
        //    c. it1 >  it2 -> it2++
        bool it2_present = it2.value != NULL;
        int compare_result = 0;
        if (it2_present) {
            compare_result = compare_high48(it1.key, it2.key);
            if (compare_result == 0) {
                // Case 2a: iterators at the same high key position.
                leaf_t *leaf1 = (leaf_t *)it1.value;
                leaf_t leaf2 = (leaf_t)*it2.value;

                // We do the computation "in place" only when c1 is not a
                // shared container. Rationale: using a shared container
                // safely with in place computation would require making a
                // copy and then doing the computation in place which is
                // likely less efficient than avoiding in place entirely and
                // always generating a new container.
                uint8_t typecode = get_typecode(*leaf1);
                container_t *container = get_container(r1, *leaf1);
                uint8_t typecode2;
                container_t *container2;
                if (typecode == SHARED_CONTAINER_TYPE) {
                    container2 = container_and(container, typecode,
                                               get_container(r2, leaf2),
                                               get_typecode(leaf2), &typecode2);
                } else {
                    container2 = container_iand(
                        container, typecode, get_container(r2, leaf2),
                        get_typecode(leaf2), &typecode2);
                }

                if (container2 != container) {
                    container_free(container, typecode);
                }
                if (!container_nonzero_cardinality(container2, typecode2)) {
                    container_free(container2, typecode2);
                    art_iterator_erase(&it1, NULL);
                    remove_container(r1, *leaf1);
                } else {
                    if (container2 != container) {
                        replace_container(r1, leaf1, container2, typecode2);
                    }
                    // Only advance the iterator if we didn't delete the
                    // leaf, as erasing advances by itself.
                    art_iterator_next(&it1);
                }
                art_iterator_next(&it2);
            }
        }

        if (!it2_present || compare_result < 0) {
            // Cases 1 and 3a: it1 is the only iterator or is before it2.
            leaf_t leaf;
            bool erased = art_iterator_erase(&it1, (art_val_t *)&leaf);
            assert(erased);
            container_free(get_container(r1, leaf), get_typecode(leaf));
            remove_container(r1, leaf);
        } else if (compare_result > 0) {
            // Case 2c: it1 is after it2.
            art_iterator_lower_bound(&it2, it1.key);
        }
    }
}